

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.cpp
# Opt level: O0

void ncnn::transpose(Mat *X,Mat *XT,Option *opt)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  int j;
  float *ptr;
  int i;
  float *pXT;
  float *pX;
  int h;
  int w;
  Option *opt_local;
  Mat *XT_local;
  Mat *X_local;
  
  iVar1 = X->w;
  iVar2 = X->h;
  pvVar3 = X->data;
  pvVar4 = XT->data;
  for (i = 0; i < iVar1; i = i + 1) {
    for (j = 0; j < iVar2; j = j + 1) {
      *(undefined4 *)((long)pvVar4 + (long)j * 4 + (long)(i * iVar2) * 4) =
           *(undefined4 *)((long)pvVar3 + (long)(j * iVar1 + i) * 4);
    }
  }
  return;
}

Assistant:

static void transpose(const Mat& X, Mat& XT, const Option& opt)
{
    const int w = X.w;
    const int h = X.h;

    const float* pX = X;
    float* pXT = XT;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < w; i++)
    {
        float* ptr = pXT + i * h;
        for (int j = 0; j < h; j++)
        {
            ptr[j] = pX[j * w + i];
        }
    }
}